

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Unary * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,UnaryOp *args_2,AST **args_3)

{
  Unary *expr;
  Unary *r;
  undefined8 in_stack_ffffffffffffffb8;
  UnaryOp op;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
  *in_stack_ffffffffffffffc0;
  LocationRange *in_stack_ffffffffffffffc8;
  Unary *in_stack_ffffffffffffffd0;
  
  op = (UnaryOp)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  expr = (Unary *)operator_new(0x90);
  Unary::Unary(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (Fodder *)in_stack_ffffffffffffffc0,op,(AST *)expr);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)expr);
  return expr;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }